

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void luaL_register(lua_State *L,char *libname,luaL_Reg *l)

{
  int iVar1;
  luaL_Reg *plVar2;
  char *pcVar3;
  int size;
  int szhint;
  
  if (libname != (char *)0x0) {
    szhint = 0;
    for (plVar2 = l; plVar2->name != (char *)0x0; plVar2 = plVar2 + 1) {
      szhint = szhint + 1;
    }
    luaL_findtable(L,-10000,"_LOADED",1);
    lua_getfield(L,-1,libname);
    iVar1 = lua_type(L,-1);
    if (iVar1 != 5) {
      L->top = L->top + -1;
      pcVar3 = luaL_findtable(L,-0x2712,libname,szhint);
      if (pcVar3 != (char *)0x0) {
        luaL_error(L,"name conflict for module \'%s\'",libname);
      }
      lua_pushvalue(L,-1);
      lua_setfield(L,-3,libname);
    }
    lua_remove(L,-2);
    lua_insert(L,-1);
  }
  for (; l->name != (char *)0x0; l = l + 1) {
    lua_pushcclosure(L,l->func,0);
    lua_setfield(L,-2,l->name);
  }
  return;
}

Assistant:

static void luaL_register(lua_State*L,const char*libname,
const luaL_Reg*l){
luaI_openlib(L,libname,l,0);
}